

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiLight **_dest,aiLight *src)

{
  aiLight *__dest;
  
  if (src == (aiLight *)0x0 || _dest == (aiLight **)0x0) {
    return;
  }
  __dest = (aiLight *)operator_new(0x46c);
  (__dest->mName).length = 0;
  (__dest->mName).data[0] = '\0';
  memset((__dest->mName).data + 1,0x1b,0x3ff);
  __dest->mType = aiLightSource_UNDEFINED;
  (__dest->mPosition).x = 0.0;
  (__dest->mPosition).y = 0.0;
  (__dest->mPosition).z = 0.0;
  (__dest->mDirection).x = 0.0;
  (__dest->mDirection).y = 0.0;
  *(undefined8 *)&(__dest->mDirection).z = 0;
  (__dest->mUp).x = 0.0;
  (__dest->mUp).y = 0.0;
  *(undefined8 *)&(__dest->mUp).z = 0;
  __dest->mAttenuationLinear = 1.0;
  __dest->mAttenuationQuadratic = 0.0;
  (__dest->mColorDiffuse).r = 0.0;
  (__dest->mColorDiffuse).g = 0.0;
  (__dest->mColorDiffuse).b = 0.0;
  (__dest->mColorSpecular).r = 0.0;
  (__dest->mColorSpecular).g = 0.0;
  *(undefined8 *)&(__dest->mColorSpecular).b = 0;
  (__dest->mColorAmbient).g = 0.0;
  (__dest->mColorAmbient).b = 0.0;
  __dest->mAngleInnerCone = 6.2831855;
  __dest->mAngleOuterCone = 6.2831855;
  (__dest->mSize).x = 0.0;
  (__dest->mSize).y = 0.0;
  *_dest = __dest;
  memcpy(__dest,src,0x46c);
  return;
}

Assistant:

void SceneCombiner::Copy(aiLight** _dest, const aiLight* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiLight* dest = *_dest = new aiLight();

    // get a flat copy, that's already OK
    ::memcpy(dest,src,sizeof(aiLight));
}